

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_kv_test.cc
# Opt level: O3

void kv_set_var_nentry_update_test(btree_kv_ops *kv_ops)

{
  code *pcVar1;
  char *pcVar2;
  __suseconds_t _Var3;
  int iVar4;
  undefined8 *puVar5;
  size_t sVar6;
  char *pcVar7;
  char **ppcVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  char *apcStack_d0 [13];
  undefined1 local_68 [8];
  timeval __test_begin;
  long local_40;
  char local_31 [8];
  uint8_t v;
  
  __test_begin.tv_usec = (__suseconds_t)kv_ops;
  gettimeofday((timeval *)local_68,(__timezone_ptr_t)0x0);
  memleak_start();
  puVar5 = (undefined8 *)malloc(0x1010);
  *puVar5 = 0xa000100000801;
  puVar5[1] = puVar5 + 2;
  local_31[0] = 'd';
  uVar10 = 0;
  lVar9 = 0;
  ppcVar8 = apcStack_d0 + 3;
  do {
    pcVar7 = (char *)ppcVar8;
    ppcVar8 = (char **)(pcVar7 + -0x10);
    apcStack_d0[uVar10 + 3] = (char *)ppcVar8;
    builtin_strncpy(pcVar7 + -0x18,"z0\x10",4);
    pcVar7[-0x14] = '\0';
    pcVar7[-0x13] = '\0';
    pcVar7[-0x12] = '\0';
    pcVar7[-0x11] = '\0';
    sprintf((char *)ppcVar8,"key%d",uVar10 & 0xffffffff);
    pcVar1 = *(code **)(__test_begin.tv_usec + 8);
    pcVar7[-0x18] = -0x6d;
    pcVar7[-0x17] = '0';
    pcVar7[-0x16] = '\x10';
    pcVar7[-0x15] = '\0';
    pcVar7[-0x14] = '\0';
    pcVar7[-0x13] = '\0';
    pcVar7[-0x12] = '\0';
    pcVar7[-0x11] = '\0';
    (*pcVar1)(puVar5,uVar10 & 0xffff,ppcVar8,local_31);
    lVar11 = puVar5[1];
    pcVar7[-0x18] = -0x5d;
    pcVar7[-0x17] = '0';
    pcVar7[-0x16] = '\x10';
    pcVar7[-0x15] = '\0';
    pcVar7[-0x14] = '\0';
    pcVar7[-0x13] = '\0';
    pcVar7[-0x12] = '\0';
    pcVar7[-0x11] = '\0';
    sVar6 = strlen((char *)ppcVar8);
    pcVar7[-0x18] = -0x4f;
    pcVar7[-0x17] = '0';
    pcVar7[-0x16] = '\x10';
    pcVar7[-0x15] = '\0';
    pcVar7[-0x14] = '\0';
    pcVar7[-0x13] = '\0';
    pcVar7[-0x12] = '\0';
    pcVar7[-0x11] = '\0';
    iVar4 = bcmp((void *)(lVar11 + lVar9),ppcVar8,sVar6);
    if (iVar4 != 0) {
      pcVar7[-0x18] = -0x1f;
      pcVar7[-0x17] = '0';
      pcVar7[-0x16] = '\x10';
      pcVar7[-0x15] = '\0';
      pcVar7[-0x14] = '\0';
      pcVar7[-0x13] = '\0';
      pcVar7[-0x12] = '\0';
      pcVar7[-0x11] = '\0';
      kv_set_var_nentry_update_test();
      lVar11 = local_40;
    }
    if (*(char *)(lVar11 + 8 + lVar9) != local_31[0]) {
      pcVar7[-0x18] = -8;
      pcVar7[-0x17] = '0';
      pcVar7[-0x16] = '\x10';
      pcVar7[-0x15] = '\0';
      pcVar7[-0x14] = '\0';
      pcVar7[-0x13] = '\0';
      pcVar7[-0x12] = '\0';
      pcVar7[-0x11] = '\0';
      kv_set_var_nentry_update_test();
    }
    lVar9 = lVar9 + 9;
    uVar10 = uVar10 + 1;
  } while (uVar10 != 10);
  uVar10 = 0;
  lVar9 = 0;
  do {
    pcVar2 = apcStack_d0[uVar10 + 3];
    pcVar1 = *(code **)(__test_begin.tv_usec + 8);
    builtin_strncpy(pcVar7 + -0x18,"!1\x10",4);
    pcVar7[-0x14] = '\0';
    pcVar7[-0x13] = '\0';
    pcVar7[-0x12] = '\0';
    pcVar7[-0x11] = '\0';
    (*pcVar1)(puVar5,uVar10 & 0xffff,pcVar2,local_31);
    lVar11 = puVar5[1];
    builtin_strncpy(pcVar7 + -0x18,"11\x10",4);
    pcVar7[-0x14] = '\0';
    pcVar7[-0x13] = '\0';
    pcVar7[-0x12] = '\0';
    pcVar7[-0x11] = '\0';
    sVar6 = strlen(pcVar2);
    builtin_strncpy(pcVar7 + -0x18,"?1\x10",4);
    pcVar7[-0x14] = '\0';
    pcVar7[-0x13] = '\0';
    pcVar7[-0x12] = '\0';
    pcVar7[-0x11] = '\0';
    iVar4 = bcmp((void *)(lVar11 + lVar9),pcVar2,sVar6);
    if (iVar4 != 0) {
      builtin_strncpy(pcVar7 + -0x18,"o1\x10",4);
      pcVar7[-0x14] = '\0';
      pcVar7[-0x13] = '\0';
      pcVar7[-0x12] = '\0';
      pcVar7[-0x11] = '\0';
      kv_set_var_nentry_update_test();
      lVar11 = local_40;
    }
    if (*(char *)(lVar11 + 8 + lVar9) != local_31[0]) {
      pcVar7[-0x18] = -0x7a;
      pcVar7[-0x17] = '1';
      pcVar7[-0x16] = '\x10';
      pcVar7[-0x15] = '\0';
      pcVar7[-0x14] = '\0';
      pcVar7[-0x13] = '\0';
      pcVar7[-0x12] = '\0';
      pcVar7[-0x11] = '\0';
      kv_set_var_nentry_update_test();
    }
    _Var3 = __test_begin.tv_usec;
    lVar9 = lVar9 + 9;
    uVar10 = uVar10 + 1;
  } while (uVar10 != 10);
  ppcVar8 = apcStack_d0 + 3;
  pcVar1 = *(code **)(__test_begin.tv_usec + 8);
  pcVar7[-0x18] = -0x53;
  pcVar7[-0x17] = '1';
  pcVar7[-0x16] = '\x10';
  pcVar7[-0x15] = '\0';
  pcVar7[-0x14] = '\0';
  pcVar7[-0x13] = '\0';
  pcVar7[-0x12] = '\0';
  pcVar7[-0x11] = '\0';
  (*pcVar1)(puVar5,9,apcStack_d0[3],local_31);
  pcVar7[-0x18] = -0x44;
  pcVar7[-0x17] = '1';
  pcVar7[-0x16] = '\x10';
  pcVar7[-0x15] = '\0';
  pcVar7[-0x14] = '\0';
  pcVar7[-0x13] = '\0';
  pcVar7[-0x12] = '\0';
  pcVar7[-0x11] = '\0';
  strcpy(apcStack_d0[3],apcStack_d0[0xc]);
  lVar11 = 0;
  pcVar1 = *(code **)(_Var3 + 8);
  pcVar7[-0x18] = -0x31;
  pcVar7[-0x17] = '1';
  pcVar7[-0x16] = '\x10';
  pcVar7[-0x15] = '\0';
  pcVar7[-0x14] = '\0';
  pcVar7[-0x13] = '\0';
  pcVar7[-0x12] = '\0';
  pcVar7[-0x11] = '\0';
  (*pcVar1)(puVar5,0,apcStack_d0[0xc],local_31);
  builtin_strncpy(apcStack_d0[0xc],"key0",5);
  lVar9 = puVar5[1];
  do {
    pcVar2 = *ppcVar8;
    pcVar7[-0x18] = -0x10;
    pcVar7[-0x17] = '1';
    pcVar7[-0x16] = '\x10';
    pcVar7[-0x15] = '\0';
    pcVar7[-0x14] = '\0';
    pcVar7[-0x13] = '\0';
    pcVar7[-0x12] = '\0';
    pcVar7[-0x11] = '\0';
    sVar6 = strlen(pcVar2);
    pcVar7[-0x18] = -2;
    pcVar7[-0x17] = '1';
    pcVar7[-0x16] = '\x10';
    pcVar7[-0x15] = '\0';
    pcVar7[-0x14] = '\0';
    pcVar7[-0x13] = '\0';
    pcVar7[-0x12] = '\0';
    pcVar7[-0x11] = '\0';
    iVar4 = bcmp((void *)(lVar9 + lVar11),pcVar2,sVar6);
    if (iVar4 != 0) {
      builtin_strncpy(pcVar7 + -0x18,"/2\x10",4);
      pcVar7[-0x14] = '\0';
      pcVar7[-0x13] = '\0';
      pcVar7[-0x12] = '\0';
      pcVar7[-0x11] = '\0';
      kv_set_var_nentry_update_test();
      lVar9 = local_40;
    }
    if (*(char *)(lVar9 + 8 + lVar11) != local_31[0]) {
      builtin_strncpy(pcVar7 + -0x18,"J2\x10",4);
      pcVar7[-0x14] = '\0';
      pcVar7[-0x13] = '\0';
      pcVar7[-0x12] = '\0';
      pcVar7[-0x11] = '\0';
      kv_set_var_nentry_update_test();
      lVar9 = local_40;
    }
    lVar11 = lVar11 + 9;
    ppcVar8 = ppcVar8 + 1;
  } while (lVar11 != 0x5a);
  builtin_strncpy(pcVar7 + -0x18,"a2\x10",4);
  pcVar7[-0x14] = '\0';
  pcVar7[-0x13] = '\0';
  pcVar7[-0x12] = '\0';
  pcVar7[-0x11] = '\0';
  kv_set_var_nentry_update_test();
  return;
}

Assistant:

void kv_set_var_nentry_update_test(btree_kv_ops *kv_ops)
{
    TEST_INIT();
    memleak_start();

    bnoderef node;
    uint8_t v;
    int i, n = 10;
    uint8_t ksize = 8;
    uint8_t vsize = sizeof(v);
    size_t offset = 0;
    char **key = alca(char*, n);

    node = dummy_node(ksize, vsize, 1);
    node->nentry = n;

    v = 100;

    // first pass
    for (i = 0; i < n; i++) {
        key[i] = alca(char, ksize);
        sprintf(key[i], "key%d", i);
        kv_ops->set_kv(node, i, key[i], (void *)&v);

        TEST_CHK(!memcmp((uint8_t *)node->data + offset, key[i], strlen(key[i])));
        offset += ksize;
        TEST_CHK(!memcmp((uint8_t *)node->data + offset, &v, vsize));
        offset += vsize;

    }

    offset = 0;

    // second pass
    for (i = 0; i < n; i++) {

        kv_ops->set_kv(node, i, key[i], (void *)&v);
        TEST_CHK(!memcmp((uint8_t *)node->data + offset, key[i], strlen(key[i])));
        offset += ksize;
        TEST_CHK(!memcmp((uint8_t *)node->data + offset, &v, vsize));
        offset += vsize;
    }

    /* swap first/last entries */

    // copy first key to last
    kv_ops->set_kv(node, n-1, key[0], (void *)&v);
    strcpy(key[0], key[n-1]);

    // copy last key to first
    kv_ops->set_kv(node, 0, key[n-1], (void *)&v);
    strcpy(key[n-1], "key0");

    // verify
    offset = 0;
    for (i = 0; i < n; i++) {
        TEST_CHK(!memcmp((uint8_t *)node->data + offset, key[i], strlen(key[i])));
        offset += ksize;
        TEST_CHK(!memcmp((uint8_t *)node->data + offset, &v, vsize));
        offset += vsize;
    }

    free(node);
    memleak_end();
    TEST_RESULT("kv_set_var_nentry_update_test");
}